

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall capnp::FlatMessageBuilder::requireFilled(FlatMessageBuilder *this)

{
  bool bVar1;
  ArrayPtr<const_capnp::word> *this_00;
  Fault local_68;
  Fault f;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_58;
  word *local_48;
  word *local_40;
  undefined1 local_38 [8];
  DebugComparison<const_capnp::word_*,_capnp::word_*> _kjCondition;
  FlatMessageBuilder *this_local;
  
  _kjCondition._32_8_ = this;
  local_58 = MessageBuilder::getSegmentsForOutput(&this->super_MessageBuilder);
  this_00 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[](&local_58,0);
  local_48 = kj::ArrayPtr<const_capnp::word>::end(this_00);
  local_40 = (word *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_48);
  f.exception = (Exception *)kj::ArrayPtr<capnp::word>::end(&this->array);
  kj::_::DebugExpression<capnp::word_const*>::operator==
            ((DebugComparison<const_capnp::word_*,_capnp::word_*> *)local_38,
             (DebugExpression<capnp::word_const*> *)&local_40,(word **)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*,capnp::word*>&,char_const(&)[43]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
               ,299,FAILED,"getSegmentsForOutput()[0].end() == array.end()",
               "_kjCondition,\"FlatMessageBuilder\'s buffer was too large.\"",
               (DebugComparison<const_capnp::word_*,_capnp::word_*> *)local_38,
               (char (*) [43])"FlatMessageBuilder\'s buffer was too large.");
    kj::_::Debug::Fault::fatal(&local_68);
  }
  return;
}

Assistant:

void FlatMessageBuilder::requireFilled() {
  KJ_REQUIRE(getSegmentsForOutput()[0].end() == array.end(),
          "FlatMessageBuilder's buffer was too large.");
}